

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_unix.cpp
# Opt level: O1

void __thiscall QSystemLocaleData::~QSystemLocaleData(QSystemLocaleData *this)

{
  Data *pDVar1;
  
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->uiLanguages).d);
  pDVar1 = (this->lc_collate_var).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->lc_collate_var).d.d)->super_QArrayData,1,0x10);
    }
  }
  pDVar1 = (this->lc_measurement_var).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->lc_measurement_var).d.d)->super_QArrayData,1,0x10);
    }
  }
  pDVar1 = (this->lc_messages_var).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->lc_messages_var).d.d)->super_QArrayData,1,0x10);
    }
  }
  QLocale::~QLocale(&this->lc_messages);
  QLocale::~QLocale(&this->lc_monetary);
  QLocale::~QLocale(&this->lc_time);
  QLocale::~QLocale(&this->lc_numeric);
  QReadWriteLock::~QReadWriteLock(&this->lock);
  return;
}

Assistant:

QSystemLocaleData()
        : lc_numeric(QLocale::C)
         ,lc_time(QLocale::C)
         ,lc_monetary(QLocale::C)
         ,lc_messages(QLocale::C)
    {
        readEnvironment();
    }